

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

wstring * PDA::Transducer::Generator::comment(wstring *__return_storage_ptr__,wstring *source)

{
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_60;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_40;
  undefined1 local_19;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_18;
  wstring *source_local;
  wstring *result;
  
  local_19 = 0;
  local_18 = source;
  source_local = __return_storage_ptr__;
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  std::operator+(&local_60,L"\t#***\t",local_18);
  std::operator+(&local_40,&local_60,L"\t***#");
  std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)&local_40);
  std::__cxx11::wstring::~wstring((wstring *)&local_40);
  std::__cxx11::wstring::~wstring((wstring *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::wstring Generator::comment(const std::wstring &source)
{
    std::wstring result;
    result = L"\t#***\t" + source + L"\t***#";
    return result;
}